

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

void crnlib::MatchFinder_CheckLimits(CMatchFinder *p)

{
  CMatchFinder *p_local;
  
  if (p->pos == 0xffffffff) {
    MatchFinder_Normalize(p);
  }
  if ((p->streamEndWasReached == 0) && (p->keepSizeAfter == p->streamPos - p->pos)) {
    MatchFinder_CheckAndMoveAndRead(p);
  }
  if (p->cyclicBufferPos == p->cyclicBufferSize) {
    p->cyclicBufferPos = 0;
  }
  MatchFinder_SetLimits(p);
  return;
}

Assistant:

static void MatchFinder_CheckLimits(CMatchFinder* p) {
  if (p->pos == kMaxValForNormalize)
    MatchFinder_Normalize(p);
  if (!p->streamEndWasReached && p->keepSizeAfter == p->streamPos - p->pos)
    MatchFinder_CheckAndMoveAndRead(p);
  if (p->cyclicBufferPos == p->cyclicBufferSize)
    p->cyclicBufferPos = 0;
  MatchFinder_SetLimits(p);
}